

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

void * lyplg_type_print_uint
                 (ly_ctx *UNUSED_ctx,lyd_value *value,LY_VALUE_FORMAT format,
                 void *UNUSED_prefix_data,ly_bool *dynamic,size_t *value_len)

{
  size_t sVar1;
  void *buf;
  uint64_t num;
  size_t *value_len_local;
  ly_bool *dynamic_local;
  void *UNUSED_prefix_data_local;
  lyd_value *plStack_20;
  LY_VALUE_FORMAT format_local;
  lyd_value *value_local;
  ly_ctx *UNUSED_ctx_local;
  
  buf = (void *)0x0;
  num = (uint64_t)value_len;
  value_len_local = (size_t *)dynamic;
  dynamic_local = (ly_bool *)UNUSED_prefix_data;
  UNUSED_prefix_data_local._4_4_ = format;
  plStack_20 = value;
  value_local = (lyd_value *)UNUSED_ctx;
  if (format == LY_VALUE_LYB) {
    switch(value->realtype->basetype) {
    case LY_TYPE_UINT8:
      buf = (void *)(ulong)(value->field_2).uint8;
      break;
    case LY_TYPE_UINT16:
      buf = (void *)(ulong)(value->field_2).uint16;
      break;
    case LY_TYPE_UINT32:
      buf = (void *)(ulong)(value->field_2).uint32;
      break;
    case LY_TYPE_UINT64:
      buf = (value->field_2).dyn_mem;
    }
    if (buf == (void *)(value->field_2).dec64) {
      *dynamic = '\0';
      if (value_len != (size_t *)0x0) {
        *value_len = integer_lyb_size[value->realtype->basetype];
      }
      UNUSED_ctx_local = (ly_ctx *)&value->field_2;
    }
    else {
      UNUSED_ctx_local = (ly_ctx *)calloc(1,integer_lyb_size[value->realtype->basetype]);
      if (UNUSED_ctx_local == (ly_ctx *)0x0) {
        UNUSED_ctx_local = (ly_ctx *)0x0;
      }
      else {
        *(undefined1 *)value_len_local = 1;
        if (num != 0) {
          *(size_t *)num = integer_lyb_size[plStack_20->realtype->basetype];
        }
        memcpy(UNUSED_ctx_local,&buf,integer_lyb_size[plStack_20->realtype->basetype]);
      }
    }
  }
  else {
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    if (value_len != (size_t *)0x0) {
      sVar1 = strlen(value->_canonical);
      *(size_t *)num = sVar1;
    }
    UNUSED_ctx_local = (ly_ctx *)plStack_20->_canonical;
  }
  return UNUSED_ctx_local;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_uint(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    uint64_t num = 0;
    void *buf;

    if (format == LY_VALUE_LYB) {
        switch (value->realtype->basetype) {
        case LY_TYPE_UINT8:
            num = value->uint8;
            break;
        case LY_TYPE_UINT16:
            num = value->uint16;
            break;
        case LY_TYPE_UINT32:
            num = value->uint32;
            break;
        case LY_TYPE_UINT64:
            num = value->uint64;
            break;
        default:
            break;
        }
        num = htole64(num);
        if (num == value->uint64) {
            /* values are equal, little-endian or uint8 */
            *dynamic = 0;
            if (value_len) {
                *value_len = integer_lyb_size[value->realtype->basetype];
            }
            return &value->uint64;
        } else {
            /* values differ, big-endian */
            buf = calloc(1, integer_lyb_size[value->realtype->basetype]);
            LY_CHECK_RET(!buf, NULL);

            *dynamic = 1;
            if (value_len) {
                *value_len = integer_lyb_size[value->realtype->basetype];
            }
            memcpy(buf, &num, integer_lyb_size[value->realtype->basetype]);
            return buf;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}